

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_test.hpp
# Opt level: O1

void nestl::test::
     CheckSetSize<nestl::impl::set<int,std::less<int>,nestl::test::minimal_allocator<int>>>
               (set<int,_std::less<int>,_nestl::test::minimal_allocator<int>_> *s,
               size_t expectedSize)

{
  base_ptr prVar1;
  base_ptr prVar2;
  base_ptr prVar3;
  rb_tree_node_base *prVar4;
  bool setIsEmpty;
  bool shouldBeEmpty;
  size_t dist;
  size_t cdist;
  bool local_1a;
  bool local_19;
  size_t local_18;
  size_t local_10;
  size_t local_8;
  
  local_10 = (s->m_impl).m_impl.m_node_count;
  local_18 = expectedSize;
  if (local_10 != expectedSize) {
    detail::print_tuple<char_const(&)[16],unsigned_long&,char_const(&)[8],unsigned_long>
              ((ostream *)&std::cerr,(char (*) [16])"expected size: ",&local_18,
               (char (*) [8])", got: ",&local_10);
    abort();
  }
  local_19 = expectedSize == 0;
  local_1a = local_10 == 0;
  if (local_19 != local_1a) {
    detail::print_tuple<char_const(&)[26],bool&,char_const(&)[22],bool&>
              ((ostream *)&std::cerr,(char (*) [26])"set empty method returns ",&local_1a,
               (char (*) [22])", while it should be ",&local_19);
    abort();
  }
  prVar1 = (s->m_impl).m_impl.m_header.m_left;
  prVar4 = &(s->m_impl).m_impl.m_header;
  local_10 = 0;
  prVar3 = prVar1;
  while (prVar3 != prVar4) {
    prVar2 = prVar3->m_right;
    if (prVar3->m_right == (base_ptr)0x0) {
      do {
        prVar2 = prVar3;
        prVar3 = prVar2->m_parent;
      } while (prVar2 == prVar3->m_right);
      if (prVar2->m_right == prVar3) {
        prVar3 = prVar2;
      }
    }
    else {
      do {
        prVar3 = prVar2;
        prVar2 = prVar3->m_left;
      } while (prVar3->m_left != (base_ptr)0x0);
    }
    local_10 = local_10 + 1;
  }
  if (local_10 != expectedSize) {
    detail::
    print_tuple<char_const(&)[38],unsigned_long&,char_const(&)[16],unsigned_long&,char_const(&)[10]>
              ((ostream *)&std::cerr,(char (*) [38])"distance between iterators should be ",
               &local_18,(char (*) [16])" elements, got ",&local_10,(char (*) [10])" elements");
    abort();
  }
  local_8 = 0;
  while (prVar1 != prVar4) {
    prVar3 = prVar1->m_right;
    if (prVar1->m_right == (base_ptr)0x0) {
      do {
        prVar3 = prVar1;
        prVar1 = prVar3->m_parent;
      } while (prVar3 == prVar1->m_right);
      if (prVar3->m_right == prVar1) {
        prVar1 = prVar3;
      }
    }
    else {
      do {
        prVar1 = prVar3;
        prVar3 = prVar1->m_left;
      } while (prVar1->m_left != (base_ptr)0x0);
    }
    local_8 = local_8 + 1;
  }
  if (local_8 == expectedSize) {
    return;
  }
  detail::
  print_tuple<char_const(&)[44],unsigned_long&,char_const(&)[16],unsigned_long&,char_const(&)[10]>
            ((ostream *)&std::cerr,(char (*) [44])"distance between const iterators should be ",
             &local_18,(char (*) [16])" elements, got ",&local_8,(char (*) [10])" elements");
  abort();
}

Assistant:

void CheckSetSize(const Set& s, size_t expectedSize)
{
    if (s.size() != expectedSize)
    {
        fatal_failure("expected size: ", expectedSize, ", got: ", s.size());
    }

    bool shouldBeEmpty = (expectedSize == 0);
    bool setIsEmpty = s.empty();

    if (setIsEmpty != shouldBeEmpty)
    {
        fatal_failure("set empty method returns ", setIsEmpty, ", while it should be ", shouldBeEmpty);
    }

    size_t dist = std::distance(s.begin(), s.end());
    if (dist != expectedSize)
    {
        fatal_failure("distance between iterators should be ", expectedSize, " elements, got ", dist, " elements");
    }

    size_t cdist = std::distance(s.cbegin(), s.cend());
    if (cdist != expectedSize)
    {
        fatal_failure("distance between const iterators should be " ,expectedSize, " elements, got ", cdist, " elements");
    }
}